

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend_openssl.cpp
# Opt level: O2

void q_loadCiphersForConnection
               (SSL *connection,QList<QSslCipher> *ciphers,QList<QSslCipher> *defaultCiphers)

{
  long lVar1;
  char cVar2;
  int iVar3;
  stack_st_SSL_CIPHER *a;
  SSL_CIPHER *cipher;
  int i;
  int b;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_d0;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  QSslCipher ciph;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  a = q_SSL_get_ciphers(connection);
  b = 0;
  while( true ) {
    iVar3 = q_OPENSSL_sk_num((OPENSSL_STACK *)a);
    if (iVar3 <= b) break;
    cipher = (SSL_CIPHER *)q_OPENSSL_sk_value((OPENSSL_STACK *)a,b);
    if (cipher != (SSL_CIPHER *)0x0) {
      _ciph = 0xaaaaaaaaaaaaaaaa;
      QTlsBackendOpenSSL::qt_OpenSSL_cipher_to_QSslCipher((QTlsBackendOpenSSL *)&ciph,cipher);
      cVar2 = QSslCipher::isNull();
      if (cVar2 == '\0') {
        QSslCipher::name();
        QString::toLower_helper((QString *)&local_58);
        cVar2 = QString::startsWith((QLatin1String *)&local_58,3);
        if (cVar2 == '\0') {
          QSslCipher::name();
          QString::toLower_helper((QString *)&local_88);
          cVar2 = QString::startsWith((QLatin1String *)&local_88,7);
          if (cVar2 == '\0') {
            QSslCipher::name();
            QString::toLower_helper((QString *)&local_b8);
            cVar2 = QString::startsWith((QLatin1String *)&local_b8,5);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
            if (cVar2 == '\0') {
              QList<QSslCipher>::emplaceBack<QSslCipher_const&>(ciphers,&ciph);
              iVar3 = QSslCipher::usedBits();
              if (0x7f < iVar3) {
                QList<QSslCipher>::emplaceBack<QSslCipher_const&>(defaultCiphers,&ciph);
              }
            }
          }
          else {
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
          }
        }
        else {
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
        }
      }
      QSslCipher::~QSslCipher(&ciph);
    }
    b = b + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void q_loadCiphersForConnection(SSL *connection, QList<QSslCipher> &ciphers,
                                       QList<QSslCipher> &defaultCiphers)
{
    Q_ASSERT(connection);

    STACK_OF(SSL_CIPHER) *supportedCiphers = q_SSL_get_ciphers(connection);
    for (int i = 0; i < q_sk_SSL_CIPHER_num(supportedCiphers); ++i) {
        if (SSL_CIPHER *cipher = q_sk_SSL_CIPHER_value(supportedCiphers, i)) {
            const auto ciph = QTlsBackendOpenSSL::qt_OpenSSL_cipher_to_QSslCipher(cipher);
            if (!ciph.isNull()) {
                // Unconditionally exclude ADH and AECDH ciphers since they offer no MITM protection
                if (!ciph.name().toLower().startsWith("adh"_L1) &&
                    !ciph.name().toLower().startsWith("exp-adh"_L1) &&
                    !ciph.name().toLower().startsWith("aecdh"_L1)) {
                    ciphers << ciph;

                    if (ciph.usedBits() >= 128)
                        defaultCiphers << ciph;
                }
            }
        }
    }
}